

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Vdbe * sqlite3VdbeCreate(Parse *pParse)

{
  sqlite3 *db;
  Vdbe *pVVar1;
  Vdbe *p;
  
  db = pParse->db;
  p = (Vdbe *)sqlite3DbMallocRawNN(db,0x120);
  if (p != (Vdbe *)0x0) {
    memset(&p->aOp,0,0xb8);
    p->db = db;
    pVVar1 = db->pVdbe;
    if (pVVar1 != (Vdbe *)0x0) {
      pVVar1->pPrev = p;
    }
    p->pNext = pVVar1;
    p->pPrev = (Vdbe *)0x0;
    db->pVdbe = p;
    p->magic = 0x16bceaa5;
    p->pParse = pParse;
    pParse->pVdbe = p;
    sqlite3VdbeAddOp3(p,0x3d,0,1,0);
  }
  return p;
}

Assistant:

SQLITE_PRIVATE Vdbe *sqlite3VdbeCreate(Parse *pParse){
  sqlite3 *db = pParse->db;
  Vdbe *p;
  p = sqlite3DbMallocRawNN(db, sizeof(Vdbe) );
  if( p==0 ) return 0;
  memset(&p->aOp, 0, sizeof(Vdbe)-offsetof(Vdbe,aOp));
  p->db = db;
  if( db->pVdbe ){
    db->pVdbe->pPrev = p;
  }
  p->pNext = db->pVdbe;
  p->pPrev = 0;
  db->pVdbe = p;
  p->magic = VDBE_MAGIC_INIT;
  p->pParse = pParse;
  pParse->pVdbe = p;
  assert( pParse->aLabel==0 );
  assert( pParse->nLabel==0 );
  assert( pParse->nOpAlloc==0 );
  assert( pParse->szOpAlloc==0 );
  sqlite3VdbeAddOp2(p, OP_Init, 0, 1);
  return p;
}